

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_dep_parser.cc
# Opt level: O0

void DepParserTask::setup(search *sch,multi_ex *ec)

{
  task_data *ptVar1;
  size_type sVar2;
  reference ppeVar3;
  polylabel *this;
  wclass *pwVar4;
  size_t sVar5;
  ostream *poVar6;
  undefined8 uVar7;
  uint *puVar8;
  vector<example_*,_std::allocator<example_*>_> *in_RSI;
  search *in_RDI;
  size_t i_1;
  stringstream __msg;
  uint32_t label;
  uint32_t tag;
  uint32_t head;
  v_array<COST_SENSITIVE::wclass> *costs;
  size_t i;
  size_t n;
  v_array<unsigned_int> *tags;
  v_array<unsigned_int> *gold_tags;
  v_array<unsigned_int> *heads;
  v_array<unsigned_int> *gold_heads;
  task_data *data;
  uint *in_stack_fffffffffffffda8;
  v_array<unsigned_int> *in_stack_fffffffffffffdb0;
  uint32_t in_stack_fffffffffffffdc8;
  uint32_t in_stack_fffffffffffffdcc;
  undefined8 in_stack_fffffffffffffdd0;
  int plineNumber;
  ulong uVar9;
  undefined7 in_stack_fffffffffffffdd8;
  undefined1 uVar10;
  vw_exception *in_stack_fffffffffffffde0;
  stringstream local_1f0 [16];
  ostream local_1e0;
  undefined4 in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  uint in_stack_ffffffffffffffa0;
  uint32_t in_stack_ffffffffffffffa4;
  ulong local_50;
  
  ptVar1 = Search::search::get_task_data<task_data>(in_RDI);
  sVar2 = std::vector<example_*,_std::allocator<example_*>_>::size(in_RSI);
  v_array<unsigned_int>::resize
            ((v_array<unsigned_int> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  v_array<unsigned_int>::resize
            ((v_array<unsigned_int> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  v_array<unsigned_int>::clear(in_stack_fffffffffffffdb0);
  v_array<unsigned_int>::push_back(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  v_array<unsigned_int>::clear(in_stack_fffffffffffffdb0);
  v_array<unsigned_int>::push_back(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  local_50 = 0;
  while( true ) {
    if (sVar2 <= local_50) {
      for (uVar9 = 0; uVar9 < 6; uVar9 = uVar9 + 1) {
        v_array<unsigned_int>::resize
                  ((v_array<unsigned_int> *)
                   CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      }
      return;
    }
    ppeVar3 = std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RSI,local_50);
    this = &(*ppeVar3)->l;
    if ((ptVar1->old_style_labels & 1U) == 0) {
      sVar5 = v_array<COST_SENSITIVE::wclass>::size
                        ((v_array<COST_SENSITIVE::wclass> *)&this->simple);
      if (sVar5 == 0) {
        in_stack_fffffffffffffdcc = 0;
      }
      else {
        pwVar4 = v_array<COST_SENSITIVE::wclass>::operator[]
                           ((v_array<COST_SENSITIVE::wclass> *)&this->simple,0);
        in_stack_fffffffffffffdcc = pwVar4->class_index;
      }
      in_stack_ffffffffffffffa4 = in_stack_fffffffffffffdcc;
      sVar5 = v_array<COST_SENSITIVE::wclass>::size
                        ((v_array<COST_SENSITIVE::wclass> *)&this->simple);
      if (sVar5 < 2) {
        in_stack_fffffffffffffdc8 = (uint32_t)ptVar1->root_label;
        in_stack_ffffffffffffffa0 = in_stack_fffffffffffffdc8;
      }
      else {
        pwVar4 = v_array<COST_SENSITIVE::wclass>::operator[]
                           ((v_array<COST_SENSITIVE::wclass> *)&this->simple,1);
        in_stack_fffffffffffffdc8 = pwVar4->class_index;
        in_stack_ffffffffffffffa0 = in_stack_fffffffffffffdc8;
      }
    }
    else {
      pwVar4 = v_array<COST_SENSITIVE::wclass>::operator[]
                         ((v_array<COST_SENSITIVE::wclass> *)&this->simple,0);
      in_stack_ffffffffffffff9c = pwVar4->class_index;
      in_stack_ffffffffffffffa4 = (in_stack_ffffffffffffff9c & 0xff) - 1;
      in_stack_ffffffffffffffa0 = in_stack_ffffffffffffff9c >> 8;
    }
    plineNumber = (int)((ulong)in_stack_fffffffffffffdd0 >> 0x20);
    if (ptVar1->num_label < in_stack_ffffffffffffffa0) break;
    v_array<unsigned_int>::push_back(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    v_array<unsigned_int>::push_back(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    puVar8 = v_array<unsigned_int>::operator[](&ptVar1->heads,local_50 + 1);
    *puVar8 = 9999999;
    puVar8 = v_array<unsigned_int>::operator[](&ptVar1->tags,local_50 + 1);
    *puVar8 = 9999999;
    local_50 = local_50 + 1;
  }
  std::__cxx11::stringstream::stringstream(local_1f0);
  poVar6 = std::operator<<(&local_1e0,"invalid label ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,in_stack_ffffffffffffffa0);
  poVar6 = std::operator<<(poVar6," which is > num actions=");
  std::ostream::operator<<(poVar6,ptVar1->num_label);
  uVar10 = 1;
  uVar7 = __cxa_allocate_exception(0x38);
  std::__cxx11::stringstream::str();
  VW::vw_exception::vw_exception
            (in_stack_fffffffffffffde0,(char *)CONCAT17(uVar10,in_stack_fffffffffffffdd8),
             plineNumber,(string *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  __cxa_throw(uVar7,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

void setup(Search::search &sch, multi_ex &ec)
{
  task_data *data = sch.get_task_data<task_data>();
  v_array<uint32_t> &gold_heads = data->gold_heads, &heads = data->heads, &gold_tags = data->gold_tags,
                    &tags = data->tags;
  size_t n = ec.size();
  heads.resize(n + 1);
  tags.resize(n + 1);
  gold_heads.clear();
  gold_heads.push_back(0);
  gold_tags.clear();
  gold_tags.push_back(0);
  for (size_t i = 0; i < n; i++)
  {
    v_array<COST_SENSITIVE::wclass> &costs = ec[i]->l.cs.costs;
    uint32_t head, tag;
    if (data->old_style_labels)
    {
      uint32_t label = costs[0].class_index;
      head = (label & 255) - 1;
      tag = label >> 8;
    }
    else
    {
      head = (costs.size() == 0) ? 0 : costs[0].class_index;
      tag = (costs.size() <= 1) ? (uint32_t)data->root_label : costs[1].class_index;
    }
    if (tag > data->num_label)
      THROW("invalid label " << tag << " which is > num actions=" << data->num_label);

    gold_heads.push_back(head);
    gold_tags.push_back(tag);
    heads[i + 1] = my_null;
    tags[i + 1] = my_null;
  }
  for (size_t i = 0; i < 6; i++) data->children[i].resize(n + (size_t)1);
}